

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void soul::ResolutionPass::ModuleInstanceResolver::resolveSpecialisationArg
               (Expression *arg,ASTObject *param)

{
  bool bVar1;
  int iVar2;
  VariableDeclaration *this;
  long lVar3;
  pool_ptr<soul::AST::ProcessorBase> pr;
  Type local_30;
  
  this = (VariableDeclaration *)
         __dynamic_cast(param,&AST::ASTObject::typeinfo,&AST::UsingDeclaration::typeinfo,0);
  if (this == (VariableDeclaration *)0x0) {
    lVar3 = __dynamic_cast(param,&AST::ASTObject::typeinfo,&AST::ProcessorAliasDeclaration::typeinfo
                           ,0);
    if (lVar3 != 0) {
      (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_30,arg);
      if (local_30._0_8_ != 0) {
        *(undefined8 *)(lVar3 + 0x38) = local_30._0_8_;
        return;
      }
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    this = (VariableDeclaration *)
           __dynamic_cast(param,&AST::ASTObject::typeinfo,&AST::VariableDeclaration::typeinfo,0);
    if (this == (VariableDeclaration *)0x0) {
      lVar3 = __dynamic_cast(param,&AST::ASTObject::typeinfo,
                             &AST::NamespaceAliasDeclaration::typeinfo,0);
      if (lVar3 != 0) {
        (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_30,arg);
        *(undefined8 *)(lVar3 + 0x40) = local_30._0_8_;
        return;
      }
      throwInternalCompilerError("resolveSpecialisationArg",0x29f);
    }
    if ((arg->kind != value) ||
       (iVar2 = (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[3])(arg),
       (char)iVar2 == '\0')) {
      throwInternalCompilerError("AST::isResolvedAsValue (arg)","resolveSpecialisationArg",0x290);
    }
    bVar1 = AST::VariableDeclaration::isResolved(this);
    if (bVar1) {
      AST::VariableDeclaration::getType(&local_30,this);
      SanityCheckPass::expectSilentCastPossible
                (&(arg->super_Statement).super_ASTObject.context,&local_30,arg);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
    }
  }
  else if ((arg->kind != type) ||
          (iVar2 = (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[3])(arg),
          (char)iVar2 == '\0')) {
    throwInternalCompilerError("AST::isResolvedAsType (arg)","resolveSpecialisationArg",0x282);
  }
  (this->initialValue).object = arg;
  return;
}

Assistant:

static void resolveSpecialisationArg (AST::Expression& arg, AST::ASTObject& param)
        {
            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                SOUL_ASSERT (AST::isResolvedAsType (arg));
                u->targetType = arg;
                return;
            }

            if (auto pa = cast<AST::ProcessorAliasDeclaration> (param))
            {
                auto pr = arg.getAsProcessor();
                pa->resolvedProcessor = *pr;
                return;
            }

            if (auto v = cast<AST::VariableDeclaration> (param))
            {
                SOUL_ASSERT (AST::isResolvedAsValue (arg));

                if (v->isResolved())
                    SanityCheckPass::expectSilentCastPossible (arg.context, v->getType(), arg);

                v->initialValue = arg;
                return;
            }

            if (auto n = cast<AST::NamespaceAliasDeclaration> (param))
            {
                n->resolvedNamespace = arg.getAsNamespace();
                return;
            }

            SOUL_ASSERT_FALSE;
        }